

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppendFromSelf
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,size_t offset,size_t len)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char c;
  char local_29;
  
  pcVar2 = this->op_ptr_ + (this->full_size_ - (long)this->op_base_);
  if (((char *)(offset - 1) < pcVar2) && (len <= this->expected_ - (long)pcVar2)) {
    bVar1 = true;
    if (len != 0) {
      uVar3 = (long)pcVar2 - offset;
      do {
        local_29 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 >> 0x10][uVar3 & 0xffff];
        if (this->op_limit_ == this->op_ptr_) {
          SlowAppend(this,&local_29,1);
        }
        else {
          *this->op_ptr_ = local_29;
          this->op_ptr_ = this->op_ptr_ + 1;
        }
        len = len - 1;
        uVar3 = uVar3 + 1;
      } while (len != 0);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline size_t Size() const {
    return full_size_ + (op_ptr_ - op_base_);
  }